

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O0

void __thiscall GOESRImageHandler::handleImage(GOESRImageHandler *this,GOESRProduct *product)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  element_type *this_01;
  Handler *in_RSI;
  GOESRImageHandler *in_RDI;
  string path;
  Mat mat;
  GOESRImageHandler *in_stack_000000d0;
  GradientPoint p;
  pair<const_unsigned_int,_float> *i;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  *__range2;
  Mat gradientMap;
  map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  idf;
  iterator grad;
  string *productName;
  FilenameBuilder fb;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  Timer t;
  GOESRProduct *in_stack_fffffffffffff9e8;
  FilenameBuilder *in_stack_fffffffffffff9f0;
  string *this_02;
  bool local_5c9;
  string local_590 [16];
  Handler *in_stack_fffffffffffffa80;
  GOESRProduct *in_stack_fffffffffffffa88;
  string *in_stack_fffffffffffffa90;
  File *in_stack_fffffffffffffa98;
  FileWriter *in_stack_fffffffffffffaa0;
  Mat local_550 [8];
  Mat *in_stack_fffffffffffffab8;
  Image *in_stack_fffffffffffffac0;
  float local_4e8;
  float local_4e4;
  float local_4e0;
  GradientInterpolationType in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb2c;
  _Self local_4c8;
  _Self local_4c0;
  undefined1 *local_4b8;
  Mat local_4b0 [8];
  string *in_stack_fffffffffffffb58;
  string *in_stack_fffffffffffffb60;
  FilenameBuilder *in_stack_fffffffffffffb68;
  _Self local_450;
  undefined1 local_448 [48];
  _Base_ptr local_418;
  _Self local_410;
  _Self local_408;
  Product *local_400;
  GOESRProduct *in_stack_fffffffffffffe68;
  undefined1 local_18 [24];
  
  Timer::Timer((Timer *)in_stack_fffffffffffff9f0);
  if (*(long *)&(in_RDI->config_).field_0x158 == 0) {
    GOESRProduct::getImage(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    GOESRProduct::getFilenameBuilder((GOESRProduct *)in_RDI,in_RSI);
    local_400 = GOESRProduct::getProduct((GOESRProduct *)in_RSI);
    local_408._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                 *)in_stack_fffffffffffff9e8,(key_type *)0x29e664);
    local_410._M_node =
         (_Base_ptr)
         std::
         end<std::map<std::__cxx11::string,Gradient,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Gradient>>>>
                   ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                     *)in_stack_fffffffffffff9e8);
    bVar1 = std::operator==(&local_408,&local_410);
    local_5c9 = false;
    if (bVar1) {
      local_5c9 = std::operator==(&in_stack_fffffffffffff9f0->dir,(char *)in_stack_fffffffffffff9e8)
      ;
    }
    if (local_5c9 != false) {
      GOESRProduct::getChannel((GOESRProduct *)in_RSI);
      local_418 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                          *)in_stack_fffffffffffff9e8,(key_type *)0x29e728);
      local_408._M_node = local_418;
    }
    GOESRProduct::loadImageDataFunction(in_stack_fffffffffffffe68);
    local_450._M_node =
         (_Base_ptr)
         std::
         end<std::map<std::__cxx11::string,Gradient,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Gradient>>>>
                   ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                     *)in_stack_fffffffffffff9e8);
    bVar2 = std::operator!=(&local_408,&local_450);
    bVar1 = false;
    if (bVar2) {
      sVar3 = std::
              map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
              ::size((map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                      *)0x29e7ed);
      bVar1 = sVar3 == 0x100;
    }
    if (bVar1) {
      cv::Mat::Mat(local_4b0,0x100,1,0x10);
      local_4b8 = local_448;
      local_4c0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
           ::begin((map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                    *)in_stack_fffffffffffff9e8);
      local_4c8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
           ::end((map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                  *)in_stack_fffffffffffff9e8);
      while (bVar1 = std::operator!=(&local_4c0,&local_4c8), bVar1) {
        this_00 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_float>_>::operator*
                            ((_Rb_tree_iterator<std::pair<const_unsigned_int,_float>_> *)0x29e88a);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>
                      *)0x29e89f);
        Gradient::interpolate
                  ((Gradient *)this_00,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28);
        (&in_stack_fffffffffffffb60->_M_dataplus)[this_00->first * 3] =
             SUB41((int)(local_4e0 * 255.0),0);
        (&in_stack_fffffffffffffb60->_M_dataplus)[this_00->first * 3 + 1] =
             SUB41((int)(local_4e4 * 255.0),0);
        (&in_stack_fffffffffffffb60->_M_dataplus)[this_00->first * 3 + 2] =
             SUB41((int)(local_4e8 * 255.0),0);
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_float>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_unsigned_int,_float>_> *)
                   in_stack_fffffffffffff9f0);
      }
      std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                ((unique_ptr<Image,_std::default_delete<Image>_> *)0x29e9bf);
      Image::remap(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      cv::Mat::~Mat(local_4b0);
    }
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
              ((unique_ptr<Image,_std::default_delete<Image>_> *)0x29e9eb);
    Image::getRawImage((Image *)in_stack_fffffffffffff9e8);
    overlayMaps(in_RDI,(GOESRProduct *)in_RSI,local_550);
    this_02 = &(in_RDI->config_).filename;
    std::__cxx11::string::string(local_590,(string *)&(in_RDI->config_).format);
    FilenameBuilder::build
              (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    std::__cxx11::string::~string(local_590);
    this_01 = std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x29ea8a);
    FileWriter::write(this_01,(int)&stack0xfffffffffffffa90,local_550,(size_t)local_18);
    if (((in_RDI->config_).json & 1U) != 0) {
      in_stack_fffffffffffff9f0 =
           (FilenameBuilder *)
           std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x29ead5);
      GOESRProduct::firstFile((GOESRProduct *)0x29eae4);
      FileWriter::writeHeader
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffa90);
    cv::Mat::~Mat(local_550);
    std::
    map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::~map((map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
            *)0x29eb8c);
    FilenameBuilder::~FilenameBuilder(in_stack_fffffffffffff9f0);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)this_02);
  }
  else {
    GOESRProduct::GOESRProduct((GOESRProduct *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    handleImageForFalseColor(in_stack_000000d0,_mat);
    GOESRProduct::~GOESRProduct((GOESRProduct *)in_stack_fffffffffffff9f0);
  }
  return;
}

Assistant:

void GOESRImageHandler::handleImage(GOESRProduct product) {
  Timer t;

  // If this handler is configured to produce false color images
  // we pass the image to a separate handler.
  if (config_.lut.data) {
    handleImageForFalseColor(std::move(product));
    return;
  }

  auto image = product.getImage(config_);
  auto fb = product.getFilenameBuilder(config_);

  // If there's a parametric gradient configured, use it in
  // combination with the LRIT ImageDataFunction to map
  // CMIP grey levels to temperature units (Kelvin), then map
  // those temperatures onto the RGB gradient.
  const auto& productName = product.getProduct().nameShort;
  auto grad = config_.gradient.find(productName);

  // For CMIP files we use the channel name to find the gradient.
  if (grad == std::end(config_.gradient) && productName == "CMIP") {
    grad = config_.gradient.find(product.getChannel().nameShort);
  }

  auto idf = product.loadImageDataFunction();

  // This is stored in an 256x1 RGB matrix for use in Image::remap()
  if (grad != std::end(config_.gradient) && idf.size() == 256) {
    cv::Mat gradientMap(256, 1, CV_8UC3);
    for (const auto& i : idf) {
      auto p = grad->second.interpolate(i.second, config_.lerptype);
      gradientMap.data[i.first * 3] = p.rgb[2] * 255;
      gradientMap.data[i.first * 3 + 1] = p.rgb[1] * 255;
      gradientMap.data[i.first * 3 + 2] = p.rgb[0] * 255;
    }
    image->remap(gradientMap);
  }

  auto mat = image->getRawImage();
  overlayMaps(product, mat);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, mat, &t);
  if (config_.json) {
    fileWriter_->writeHeader(product.firstFile(), path);
  }
}